

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

GMTOffsetField *
icu_63::GMTOffsetField::createTimeField(FieldType type,uint8_t width,UErrorCode *status)

{
  GMTOffsetField *pGVar1;
  undefined3 in_register_00000031;
  undefined4 in_register_00000034;
  
  if (U_ZERO_ERROR < *status) {
    return (GMTOffsetField *)0x0;
  }
  pGVar1 = (GMTOffsetField *)
           UMemory::operator_new
                     ((UMemory *)0x18,
                      CONCAT44(in_register_00000034,CONCAT31(in_register_00000031,width)));
  if (pGVar1 == (GMTOffsetField *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    pGVar1 = (GMTOffsetField *)0x0;
  }
  else {
    pGVar1->_vptr_GMTOffsetField = (_func_int **)&PTR__GMTOffsetField_00475510;
    pGVar1->fText = (UChar *)0x0;
    pGVar1->fType = type;
    pGVar1->fWidth = width;
  }
  return pGVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }